

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  int *piVar2;
  ImGuiColorMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiContext_conflict1 *pIVar8;
  int iVar9;
  ImGuiColorMod *__dest;
  int iVar10;
  ImGuiContext_conflict1 *ctx;
  int iVar11;
  ImVec4 *pIVar12;
  
  pIVar8 = GImGui;
  pIVar12 = (GImGui->Style).Colors + idx;
  fVar4 = pIVar12->x;
  fVar5 = pIVar12->y;
  pIVar1 = (GImGui->Style).Colors + idx;
  fVar6 = pIVar1->z;
  fVar7 = pIVar1->w;
  iVar9 = (GImGui->ColorStack).Size;
  if (iVar9 == (GImGui->ColorStack).Capacity) {
    if (iVar9 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar9 / 2 + iVar9;
    }
    iVar11 = iVar9 + 1;
    if (iVar9 + 1 < iVar10) {
      iVar11 = iVar10;
    }
    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar2 = *piVar2 + 1;
    __dest = (ImGuiColorMod *)(*GImAllocatorAllocFunc)((long)iVar11 * 0x14,GImAllocatorUserData);
    pIVar3 = (pIVar8->ColorStack).Data;
    if (pIVar3 != (ImGuiColorMod *)0x0) {
      memcpy(__dest,pIVar3,(long)(pIVar8->ColorStack).Size * 0x14);
      pIVar3 = (pIVar8->ColorStack).Data;
      if ((pIVar3 != (ImGuiColorMod *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (pIVar8->ColorStack).Data = __dest;
    (pIVar8->ColorStack).Capacity = iVar11;
    iVar9 = (pIVar8->ColorStack).Size;
  }
  else {
    __dest = (GImGui->ColorStack).Data;
  }
  __dest[iVar9].Col = idx;
  pIVar1 = &__dest[iVar9].BackupValue;
  pIVar1->x = fVar4;
  pIVar1->y = fVar5;
  pIVar1->z = fVar6;
  pIVar1->w = fVar7;
  (pIVar8->ColorStack).Size = (pIVar8->ColorStack).Size + 1;
  pIVar12->x = (float)(col & 0xff) * 0.003921569;
  (pIVar8->Style).Colors[idx].y = (float)(col >> 8 & 0xff) * 0.003921569;
  (pIVar8->Style).Colors[idx].z = (float)(col >> 0x10 & 0xff) * 0.003921569;
  (pIVar8->Style).Colors[idx].w = (float)(col >> 0x18) * 0.003921569;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}